

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringalgorithms_p.h
# Opt level: O1

QByteArray *
QStringAlgorithms<const_QByteArray>::simplified_helper
          (QByteArray *__return_storage_ptr__,QByteArray *str)

{
  byte *pbVar1;
  long lVar2;
  Data *pDVar3;
  char *pcVar4;
  qsizetype qVar5;
  byte *pbVar6;
  bool bVar7;
  byte bVar9;
  byte *pbVar10;
  byte *pbVar11;
  long in_FS_OFFSET;
  bool bVar12;
  QByteArray local_58;
  long local_38;
  bool bVar8;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = (str->d).size;
  if (lVar2 == 0) {
    pDVar3 = (str->d).d;
    (__return_storage_ptr__->d).d = pDVar3;
    (__return_storage_ptr__->d).ptr = (str->d).ptr;
    (__return_storage_ptr__->d).size = 0;
    if (pDVar3 != (Data *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    pbVar11 = (byte *)(str->d).ptr;
    pbVar1 = pbVar11 + lVar2;
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray(&local_58,lVar2,Uninitialized);
    bVar7 = true;
    pbVar10 = (byte *)local_58.d.ptr;
    bVar8 = true;
    while( true ) {
      while (((pbVar11 != pbVar1 && (*pbVar11 < 0x40)) &&
             ((1L << (*pbVar11 & 0x3f) & 0x100003e00U) != 0))) {
        pbVar11 = pbVar11 + 1;
      }
      bVar12 = pbVar11 == pbVar1;
      if (bVar12) break;
      bVar9 = *pbVar11;
      if ((0x3f < bVar9) || ((1L << (bVar9 & 0x3f) & 0x100003e00U) == 0)) {
        pbVar6 = pbVar11 + 1;
        do {
          pbVar11 = pbVar6;
          *pbVar10 = bVar9;
          bVar12 = pbVar11 == pbVar1;
          if (bVar12) {
            pbVar10 = pbVar10 + 1;
            goto LAB_0030b2a0;
          }
          bVar9 = *pbVar11;
          pbVar10 = pbVar10 + 1;
          pbVar6 = pbVar11 + 1;
        } while ((0x3f < bVar9) || ((1L << (bVar9 & 0x3f) & 0x100003e00U) == 0));
      }
      if (bVar12) break;
      bVar7 = bVar8;
      if (*pbVar11 != 0x20) {
        bVar7 = false;
      }
      *pbVar10 = 0x20;
      pbVar10 = pbVar10 + 1;
      bVar8 = bVar7;
    }
LAB_0030b2a0:
    if ((pbVar10 != (byte *)local_58.d.ptr) && (pbVar10[-1] == 0x20)) {
      pbVar10 = pbVar10 + -1;
    }
    lVar2 = (str->d).size;
    if (((long)pbVar10 - (long)local_58.d.ptr == lVar2) && (bVar7)) {
      pDVar3 = (str->d).d;
      (__return_storage_ptr__->d).d = pDVar3;
      (__return_storage_ptr__->d).ptr = (str->d).ptr;
      (__return_storage_ptr__->d).size = lVar2;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      QByteArray::resize(&local_58,(long)pbVar10 - (long)local_58.d.ptr);
      qVar5 = local_58.d.size;
      pcVar4 = local_58.d.ptr;
      pDVar3 = local_58.d.d;
      local_58.d.d = (Data *)0x0;
      local_58.d.ptr = (char *)0x0;
      (__return_storage_ptr__->d).d = pDVar3;
      (__return_storage_ptr__->d).ptr = pcVar4;
      local_58.d.size = 0;
      (__return_storage_ptr__->d).size = qVar5;
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

static inline StringType simplified_helper(StringType &str)
    {
        if (str.isEmpty())
            return str;
        const Char *src = str.cbegin();
        const Char *end = str.cend();
        NakedStringType result = isConst || !str.isDetached() ?
                                     StringType(str.size(), Qt::Uninitialized) :
                                     std::move(str);

        Char *dst = const_cast<Char *>(result.cbegin());
        Char *ptr = dst;
        bool unmodified = true;
        while (true) {
            while (src != end && isSpace(*src))
                ++src;
            while (src != end && !isSpace(*src))
                *ptr++ = *src++;
            if (src == end)
                break;
            if (*src != QChar::Space)
                unmodified = false;
            *ptr++ = QChar::Space;
        }
        if (ptr != dst && ptr[-1] == QChar::Space)
            --ptr;

        qsizetype newlen = ptr - dst;
        if (isConst && newlen == str.size() && unmodified) {
            // nothing happened, return the original
            return str;
        }
        result.resize(newlen);
        return result;
    }